

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall google::protobuf::internal::ExtensionSet::Extension::IsInitialized(Extension *this)

{
  Arena *pAVar1;
  char cVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  void *pvVar4;
  long lVar5;
  
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4) == 10) {
    if (this->is_repeated == true) {
      pRVar3 = (this->field_0).repeated_string_value;
      if (0 < (pRVar3->super_RepeatedPtrFieldBase).current_size_) {
        lVar5 = 0;
        do {
          cVar2 = (**(code **)(*((pRVar3->super_RepeatedPtrFieldBase).rep_)->elements[lVar5] + 0x40)
                  )();
          if (cVar2 == '\0') {
            return false;
          }
          lVar5 = lVar5 + 1;
          pRVar3 = (this->field_0).repeated_string_value;
        } while (lVar5 < (pRVar3->super_RepeatedPtrFieldBase).current_size_);
      }
    }
    else if ((this->field_0xa & 1) == 0) {
      pAVar1 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_;
      if ((this->field_0xa & 0x10) == 0) {
        cVar2 = (*(code *)(pAVar1->impl_).options_.initial_block_size)();
      }
      else {
        pvVar4 = (*(pAVar1->impl_).options_.block_alloc)
                           ((size_t)(this->field_0).repeated_string_value);
        cVar2 = (char)pvVar4;
      }
      if (cVar2 == '\0') {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool ExtensionSet::Extension::IsInitialized() const {
  if (cpp_type(type) == WireFormatLite::CPPTYPE_MESSAGE) {
    if (is_repeated) {
      for (int i = 0; i < repeated_message_value->size(); i++) {
        if (!repeated_message_value->Get(i).IsInitialized()) {
          return false;
        }
      }
    } else {
      if (!is_cleared) {
        if (is_lazy) {
          if (!lazymessage_value->IsInitialized()) return false;
        } else {
          if (!message_value->IsInitialized()) return false;
        }
      }
    }
  }
  return true;
}